

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O2

Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
__thiscall
rc::gen::detail::
ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
::generate<char>(ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
                 *this,Random *random,int size,Gen<char> *gens)

{
  Number NVar1;
  long lVar2;
  undefined4 in_register_00000014;
  unsigned_long *puVar3;
  Random *pRVar4;
  size_t in_R8;
  Constant<bool> in_stack_ffffffffffffff08;
  anon_class_1_1_527bc8f1 local_e9;
  Shrinkable<std::vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>_> local_e8;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>_ptr
  *local_e0;
  Shrinkables<char> shrinkables;
  Random r;
  
  puVar3 = (unsigned_long *)CONCAT44(in_register_00000014,size);
  pRVar4 = &r;
  for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pRVar4->m_key)._M_elems[0] = *puVar3;
    puVar3 = puVar3 + 1;
    pRVar4 = (Random *)((pRVar4->m_key)._M_elems + 1);
  }
  Random::split((Random *)&shrinkables,&r);
  NVar1 = Random::next((Random *)&shrinkables);
  generateShrinkables<char,rc::fn::Constant<bool>>
            (&shrinkables,(detail *)&r,(Random *)((ulong)gens & 0xffffffff),
             (int)(NVar1 % (ulong)(long)((int)gens + 1)),in_R8,(Gen<char> *)0x1,
             in_stack_ffffffffffffff08);
  rc::shrinkable::
  shrinkRecur<std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>,rc::gen::detail::ContainerHelper<std::__cxx11::string,rc::gen::detail::GenericContainerStrategy<std::__cxx11::string,false,false>>::generate<char>(rc::Random_const&,int,rc::Gen<char>const&)const::_lambda(std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>const&)_1_>
            ((shrinkable *)&local_e8,&shrinkables,&local_e9);
  local_e0 = toContainer<std::__cxx11::string,char>;
  makeShrinkable<rc::shrinkable::detail::MapShrinkable<std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>,std::__cxx11::string(*)(std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>const&)>,rc::Shrinkable<std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>>,std::__cxx11::string(*)(std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>const&)>
            ((rc *)this,&local_e8,&local_e0);
  Shrinkable<std::vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>_>::
  ~Shrinkable(&local_e8);
  std::vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>::~vector(&shrinkables);
  return (Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(IShrinkableImpl *)this;
}

Assistant:

Shrinkable<Container>
  generate(const Random &random, int size, const Gen<Ts> &... gens) const {
    const auto strategy = m_strategy;
    auto r = random;
    std::size_t count = r.split().next() % (size + 1);
    auto shrinkables = strategy.generateElements(r, size, count, gens...);

    using Elements = decltype(shrinkables);
    return shrinkable::map(
        shrinkable::shrinkRecur(std::move(shrinkables),
                                [=](const Elements &elements) {
                                  return seq::concat(
                                      shrink::removeChunks(elements),
                                      strategy.shrinkElements(elements));
                                }),
        &toContainer<Container, typename Elements::value_type::ValueType>);
  }